

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O3

LiteralString * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::__cxx11::u32string,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
          (Allocator *this,LocationRange *args,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_1,basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                  *args_2,TokenKind *args_3,char (*args_4) [1],char (*args_5) [1])

{
  size_t *psVar1;
  TokenKind token_kind;
  Allocator *pAVar2;
  LiteralString *this_00;
  size_t sVar3;
  _List_node_base *p_Var4;
  string local_78;
  Allocator *local_58;
  string local_50;
  
  local_58 = this;
  this_00 = (LiteralString *)operator_new(0xe8);
  token_kind = *args_3;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  sVar3 = strlen(*args_4);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,args_4,args_4 + sVar3);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  sVar3 = strlen(*args_5);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,args_5,args_5 + sVar3);
  LiteralString::LiteralString(this_00,args,args_1,args_2,token_kind,&local_78,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  pAVar2 = local_58;
  p_Var4 = (_List_node_base *)operator_new(0x18);
  p_Var4[1]._M_next = (_List_node_base *)this_00;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(pAVar2->allocated).
            super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return this_00;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }